

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_property.c
# Opt level: O0

int mpt_line_set(mpt_line *li,char *name,mpt_convertable *src)

{
  int iVar1;
  int type_1;
  int type;
  int len;
  mpt_convertable *src_local;
  char *name_local;
  mpt_line *li_local;
  
  if (name == (char *)0x0) {
    if (src == (mpt_convertable *)0x0) {
      li_local._4_4_ = -4;
    }
    else {
      iVar1 = mpt_line_typeid();
      if ((0 < iVar1) && (iVar1 = (*src->_vptr->convert)(src,(long)iVar1,li), -1 < iVar1)) {
        if (iVar1 == 0) {
          (li->color).alpha = 0xff;
          (li->color).red = '\0';
          (li->color).green = '\0';
          (li->color).blue = '\0';
          (li->attr).style = '\x01';
          (li->attr).width = '\x01';
          (li->attr).symbol = '\0';
          (li->attr).size = '\n';
          (li->from).x = 0.0;
          (li->from).y = 0.0;
          (li->to).x = 0.0;
          (li->to).y = 0.0;
        }
        return 0;
      }
      iVar1 = mpt_color_typeid();
      if ((0 < iVar1) && (iVar1 = (*src->_vptr->convert)(src,(long)iVar1,li), -1 < iVar1)) {
        if (iVar1 == 0) {
          (li->color).alpha = 0xff;
          (li->color).red = '\0';
          (li->color).green = '\0';
          (li->color).blue = '\0';
        }
        return 0;
      }
      iVar1 = mpt_lattr_typeid();
      if ((0 < iVar1) && (iVar1 = (*src->_vptr->convert)(src,(long)iVar1,&li->attr), -1 < iVar1)) {
        if (iVar1 == 0) {
          (li->attr).style = '\x01';
          (li->attr).width = '\x01';
          (li->attr).symbol = '\0';
          (li->attr).size = '\n';
        }
        return 0;
      }
      li_local._4_4_ = -3;
    }
  }
  else if (*name == '\0') {
    if (src == (mpt_convertable *)0x0) {
      (li->color).alpha = 0xff;
      (li->color).red = '\0';
      (li->color).green = '\0';
      (li->color).blue = '\0';
      (li->attr).style = '\x01';
      (li->attr).width = '\x01';
      (li->attr).symbol = '\0';
      (li->attr).size = '\n';
      (li->from).x = 0.0;
      (li->from).y = 0.0;
      (li->to).x = 0.0;
      (li->to).y = 0.0;
      li_local._4_4_ = 0;
    }
    else {
      iVar1 = mpt_color_typeid();
      if ((0 < iVar1) && (iVar1 = (*src->_vptr->convert)(src,(long)iVar1,li), 0 < iVar1)) {
        return 0;
      }
      li_local._4_4_ = -3;
    }
  }
  else {
    iVar1 = strcmp(name,"x1");
    if (iVar1 == 0) {
      li_local._4_4_ = setPosition(&(li->from).x,src);
    }
    else {
      iVar1 = strcmp(name,"x2");
      if (iVar1 == 0) {
        li_local._4_4_ = setPosition(&(li->to).x,src);
      }
      else {
        iVar1 = strcmp(name,"y1");
        if (iVar1 == 0) {
          li_local._4_4_ = setPosition(&(li->from).y,src);
        }
        else {
          iVar1 = strcmp(name,"y2");
          if (iVar1 == 0) {
            li_local._4_4_ = setPosition(&(li->to).y,src);
          }
          else {
            iVar1 = strcasecmp(name,"color");
            if (iVar1 == 0) {
              li_local._4_4_ = mpt_color_pset(&li->color,src);
            }
            else {
              iVar1 = strcasecmp(name,"width");
              if (iVar1 == 0) {
                li_local._4_4_ = mpt_lattr_width(&li->attr,src);
              }
              else {
                iVar1 = strcasecmp(name,"style");
                if (iVar1 == 0) {
                  li_local._4_4_ = mpt_lattr_style(&li->attr,src);
                }
                else {
                  iVar1 = strcasecmp(name,"symbol");
                  if (iVar1 == 0) {
                    li_local._4_4_ = mpt_lattr_symbol(&li->attr,src);
                  }
                  else {
                    iVar1 = strcasecmp(name,"size");
                    if (iVar1 == 0) {
                      li_local._4_4_ = mpt_lattr_size(&li->attr,src);
                    }
                    else {
                      li_local._4_4_ = -1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return li_local._4_4_;
}

Assistant:

extern int mpt_line_set(MPT_STRUCT(line) *li, const char *name, MPT_INTERFACE(convertable) *src)
{
	int len;
	
	/* auto-select matching property */
	if (!name) {
		int type;
		
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((type = mpt_line_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, li)) >= 0) {
			if (!len) *li = def_line;
			return 0;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &li->color)) >= 0) {
			if (!len) li->color = def_line.color;
			return 0;
		}
		if ((type = mpt_lattr_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &li->attr)) >= 0) {
			if (!len) li->attr = def_line.attr;
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		int type;
		if (!src) {
			*li = def_line;
			return 0;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, li)) > 0) {
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	if (!strcmp(name, "x1")) {
		return setPosition(&li->from.x, src);
	}
	if (!strcmp(name, "x2")) {
		return setPosition(&li->to.x, src);
	}
	if (!strcmp(name, "y1")) {
		return setPosition(&li->from.y, src);
	}
	if (!strcmp(name, "y2")) {
		return setPosition(&li->to.y, src);
	}
	if (!strcasecmp(name, "color")) {
		return mpt_color_pset(&li->color, src);
	}
	if (!strcasecmp(name, "width")) {
		return mpt_lattr_width(&li->attr, src);
	}
	if (!strcasecmp(name, "style")) {
		return mpt_lattr_style(&li->attr, src);
	}
	if (!strcasecmp(name, "symbol")) {
		return mpt_lattr_symbol(&li->attr, src);
	}
	if (!strcasecmp(name, "size")) {
		return mpt_lattr_size(&li->attr, src);
	}
	return MPT_ERROR(BadArgument);
}